

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Beamforming * webrtc::Config::default_value<webrtc::Beamforming>(void)

{
  int iVar1;
  Beamforming *this;
  
  if (default_value<webrtc::Beamforming>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::Beamforming>()::def);
    if (iVar1 != 0) {
      this = (Beamforming *)operator_new(0x30);
      Beamforming::Beamforming(this);
      default_value<webrtc::Beamforming>::def = this;
      __cxa_guard_release(&default_value<webrtc::Beamforming>()::def);
    }
  }
  return default_value<webrtc::Beamforming>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }